

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  size_t s;
  size_t in_stack_00000028;
  size_t in_stack_00000038;
  ulong local_10;
  
  local_10 = 10000000;
  while( true ) {
    if (10000000 < local_10) {
      return 0;
    }
    _Var1 = testbinaryfuse8(in_stack_00000038);
    if (!_Var1) {
      abort();
    }
    _Var1 = testbufferedxor8(in_stack_00000028);
    if (!_Var1) {
      abort();
    }
    _Var1 = testxor8(in_stack_00000028);
    if (!_Var1) break;
    _Var1 = testbinaryfuse16(in_stack_00000038);
    if (!_Var1) {
      abort();
    }
    _Var1 = testbufferedxor16(in_stack_00000028);
    if (!_Var1) {
      abort();
    }
    _Var1 = testxor16(in_stack_00000028);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    local_10 = local_10 * 10;
  }
  abort();
}

Assistant:

int main() {
  for (size_t s = 10000000; s <= 10000000; s *= 10) {
    if (!testbinaryfuse8(s)) { abort(); }
    if (!testbufferedxor8(s)) { abort(); }
    if (!testxor8(s)) { abort(); }
    if (!testbinaryfuse16(s)) { abort(); }
    if (!testbufferedxor16(s)) { abort(); }
    if (!testxor16(s)) { abort(); }

    printf("\n");
  }
}